

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lda.c
# Opt level: O0

void xc_lda_new(xc_func_type *func,int order,size_t np,double *rho,xc_lda_out_params *out)

{
  undefined8 in_RCX;
  undefined8 in_RDX;
  int in_ESI;
  long *in_RDI;
  undefined8 in_R8;
  double *in_stack_00000808;
  double *in_stack_00000810;
  double *in_stack_00000818;
  double *in_stack_00000820;
  size_t in_stack_00000828;
  xc_func_type *in_stack_00000830;
  double *in_stack_00000870;
  double *in_stack_00000878;
  double *in_stack_00000880;
  double *in_stack_00000888;
  double *in_stack_00000890;
  double *in_stack_00000898;
  double *in_stack_000008a0;
  double *in_stack_000008a8;
  double *in_stack_000008b0;
  double *in_stack_000008b8;
  double *in_stack_000008c0;
  double *in_stack_000008c8;
  double *in_stack_000008d0;
  double *in_stack_000008d8;
  double *in_stack_000008e0;
  double *in_stack_000008e8;
  double *in_stack_000008f0;
  double *in_stack_000008f8;
  double *in_stack_00000900;
  double *in_stack_00000908;
  double *in_stack_00000910;
  double *in_stack_00000918;
  double *in_stack_00000920;
  double *in_stack_00000928;
  double *in_stack_00000930;
  double *in_stack_00000938;
  double *in_stack_00000940;
  double *in_stack_00000948;
  double *in_stack_00000950;
  double *in_stack_00000958;
  double *in_stack_00000960;
  double *in_stack_00000968;
  double *in_stack_00000970;
  double *in_stack_00000978;
  double *in_stack_00000980;
  double *in_stack_00000988;
  double *in_stack_00000990;
  double *in_stack_00000998;
  double *in_stack_000009a0;
  double *in_stack_000009a8;
  double *in_stack_000009b0;
  double *in_stack_000009b8;
  double *in_stack_000009c0;
  double *in_stack_000009c8;
  double *in_stack_000009d0;
  double *in_stack_000009d8;
  double *in_stack_000009e0;
  double *in_stack_000009e8;
  double *in_stack_000009f0;
  double *in_stack_000009f8;
  double *in_stack_00000a00;
  double *in_stack_00000a08;
  double *in_stack_00000a10;
  double *in_stack_00000a18;
  double *in_stack_00000a20;
  double *in_stack_00000a28;
  double *in_stack_00000a30;
  double *in_stack_00000a38;
  double *in_stack_00000a40;
  double *in_stack_00000a48;
  double *in_stack_00000a50;
  double *in_stack_00000a58;
  double *in_stack_00000a60;
  double *in_stack_00000a68;
  double *in_stack_00000a70;
  double *in_stack_00000a78;
  double *in_stack_00000a80;
  double *in_stack_00000a88;
  double *in_stack_00000a90;
  double *in_stack_00000a98;
  undefined8 in_stack_fffffffffffffd98;
  xc_func_info_type *in_stack_fffffffffffffda0;
  size_t in_stack_fffffffffffffda8;
  xc_func_type *in_stack_fffffffffffffdb0;
  
  xc_lda_sanity_check(in_stack_fffffffffffffda0,(int)((ulong)in_stack_fffffffffffffd98 >> 0x20),
                      (xc_lda_out_params *)0xc2bc50);
  xc_lda_initalize(in_stack_fffffffffffffdb0,in_stack_fffffffffffffda8,
                   (xc_lda_out_params *)in_stack_fffffffffffffda0);
  if (*(long *)(*in_RDI + 0x88) != 0) {
    if ((int)in_RDI[1] == 1) {
      if (*(long *)(*(long *)(*in_RDI + 0x88) + (long)in_ESI * 8) != 0) {
        (**(code **)(*(long *)(*in_RDI + 0x88) + (long)in_ESI * 8))(in_RDI,in_RDX,in_RCX,in_R8);
      }
    }
    else if (*(long *)(*(long *)(*in_RDI + 0x88) + 0x28 + (long)in_ESI * 8) != 0) {
      (**(code **)(*(long *)(*in_RDI + 0x88) + 0x28 + (long)in_ESI * 8))(in_RDI,in_RDX,in_RCX,in_R8)
      ;
    }
  }
  if (in_RDI[3] != 0) {
    xc_mix_func(in_stack_00000830,in_stack_00000828,in_stack_00000820,in_stack_00000818,
                in_stack_00000810,in_stack_00000808,in_stack_00000870,in_stack_00000878,
                in_stack_00000880,in_stack_00000888,in_stack_00000890,in_stack_00000898,
                in_stack_000008a0,in_stack_000008a8,in_stack_000008b0,in_stack_000008b8,
                in_stack_000008c0,in_stack_000008c8,in_stack_000008d0,in_stack_000008d8,
                in_stack_000008e0,in_stack_000008e8,in_stack_000008f0,in_stack_000008f8,
                in_stack_00000900,in_stack_00000908,in_stack_00000910,in_stack_00000918,
                in_stack_00000920,in_stack_00000928,in_stack_00000930,in_stack_00000938,
                in_stack_00000940,in_stack_00000948,in_stack_00000950,in_stack_00000958,
                in_stack_00000960,in_stack_00000968,in_stack_00000970,in_stack_00000978,
                in_stack_00000980,in_stack_00000988,in_stack_00000990,in_stack_00000998,
                in_stack_000009a0,in_stack_000009a8,in_stack_000009b0,in_stack_000009b8,
                in_stack_000009c0,in_stack_000009c8,in_stack_000009d0,in_stack_000009d8,
                in_stack_000009e0,in_stack_000009e8,in_stack_000009f0,in_stack_000009f8,
                in_stack_00000a00,in_stack_00000a08,in_stack_00000a10,in_stack_00000a18,
                in_stack_00000a20,in_stack_00000a28,in_stack_00000a30,in_stack_00000a38,
                in_stack_00000a40,in_stack_00000a48,in_stack_00000a50,in_stack_00000a58,
                in_stack_00000a60,in_stack_00000a68,in_stack_00000a70,in_stack_00000a78,
                in_stack_00000a80,in_stack_00000a88,in_stack_00000a90,in_stack_00000a98);
  }
  return;
}

Assistant:

void
xc_lda_new(const xc_func_type *func, int order, size_t np, const double *rho,
       xc_lda_out_params *out)
{
  xc_lda_sanity_check(func->info, order, out);
  xc_lda_initalize(func, np, out);

  /* call the LDA routines */
  if(func->info->lda != NULL){
    if(func->nspin == XC_UNPOLARIZED){
      if(func->info->lda->unpol[order] != NULL)
        func->info->lda->unpol[order](func, np, rho, out);
    }else{
      if(func->info->lda->pol[order] != NULL)
        func->info->lda->pol[order](func, np, rho, out);
    }
  }

  if(func->mix_coef != NULL)
    xc_mix_func(func, np, rho, NULL, NULL, NULL, out->zk, out->vrho, NULL, NULL, NULL,
                out->v2rho2, NULL, NULL, NULL, NULL, NULL, NULL, NULL, NULL, NULL,
                out->v3rho3, NULL, NULL, NULL, NULL, NULL, NULL, NULL, NULL, NULL,
                NULL, NULL, NULL, NULL, NULL, NULL, NULL, NULL, NULL, NULL,
                out->v4rho4, NULL, NULL, NULL, NULL, NULL, NULL, NULL, NULL, NULL,
                NULL, NULL, NULL, NULL, NULL, NULL, NULL, NULL, NULL, NULL,
                NULL, NULL, NULL, NULL, NULL, NULL, NULL, NULL, NULL, NULL,
                NULL, NULL, NULL, NULL, NULL);
}